

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessing.c
# Opt level: O3

void parse_preproc_undef_line(Source_File *src,Translation_Data *translation_data)

{
  token *__ptr;
  void *macro;
  
  __ptr = get_next_token(src,chonky,'\0');
  if (__ptr->type == KW_ID) {
    macro = Map_Check(translation_data->macros,__ptr->data,__ptr->data_size);
    if (macro != (void *)0x0) {
      delete_macro(macro);
      Map_Remove(translation_data->macros,__ptr->data,__ptr->data_size);
    }
  }
  else {
    push_lexing_error("expected an id here",src,translation_data);
  }
  free(__ptr);
  chase_new_line(src,translation_data);
  return;
}

Assistant:

void parse_preproc_undef_line(struct Source_File *src,struct Translation_Data *translation_data)
{
	struct define_directive *hold_macro;
	struct token *id;
	
	id=get_next_token(src,&chonky[0],0);
	if(id->type!=KW_ID)
	{
		push_lexing_error("expected an id here",src,translation_data);
	}else
	{
		hold_macro=Map_Check(translation_data->macros,id->data,id->data_size);
		if(hold_macro!=NULL)
		{
			delete_macro(hold_macro);
			Map_Remove(translation_data->macros,id->data,id->data_size);
		}
	}
	free(id);
	chase_new_line(src,translation_data);
}